

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

FString __thiscall FOptionMenuTextField::Represent(FOptionMenuTextField *this)

{
  FOptionMenuFieldBase *in_RSI;
  char *local_50;
  FOptionMenuTextField *this_local;
  FString *text;
  
  if (((ulong)in_RSI[1].super_FOptionMenuItem.super_FListMenuItem._vptr_FListMenuItem & 1) == 0) {
    local_50 = FOptionMenuFieldBase::GetCVarString(in_RSI);
  }
  else {
    local_50 = (char *)((long)&in_RSI[1].super_FOptionMenuItem.super_FListMenuItem.
                               _vptr_FListMenuItem + 1);
  }
  FString::FString((FString *)this,local_50);
  if (((ulong)in_RSI[1].super_FOptionMenuItem.super_FListMenuItem._vptr_FListMenuItem & 1) != 0) {
    FString::operator+=((FString *)this,
                        ((gameinfo.gametype & GAME_DoomStrifeChex) != GAME_Any) * '\x04' + '[');
  }
  return (FString)(char *)this;
}

Assistant:

FString Represent()
	{
		FString text = mEntering ? mEditName : GetCVarString();

		if ( mEntering )
			text += ( gameinfo.gametype & GAME_DoomStrifeChex ) ? '_' : '[';

		return text;
	}